

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O2

void deqp::gls::InteractionTestUtil::computeRandomQuad
               (Random *rnd,IntegerQuad *quad,int targetWidth,int targetHeight)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float __tmp;
  undefined8 local_40;
  undefined8 uStack_38;
  
  fVar10 = ceilf((float)targetWidth * 0.5);
  fVar11 = ceilf((float)targetHeight * 0.5);
  iVar4 = de::Random::getInt(rnd,(int)fVar10,targetWidth);
  iVar5 = de::Random::getInt(rnd,(int)fVar11,targetHeight);
  lVar9 = 0;
  iVar6 = de::Random::getInt(rnd,0,targetWidth - iVar4);
  iVar7 = de::Random::getInt(rnd,0,targetHeight - iVar5);
  bVar2 = de::Random::getBool(rnd);
  bVar3 = de::Random::getBool(rnd);
  fVar10 = de::Random::choose<float,float_const*>
                     (rnd,computeRandomQuad::depthValues,getRandomColor::components);
  iVar8 = iVar5 + iVar7 + -1;
  iVar5 = iVar8;
  if (bVar3) {
    iVar5 = iVar7;
    iVar7 = iVar8;
  }
  iVar8 = iVar4 + iVar6 + -1;
  iVar4 = iVar8;
  if (bVar2) {
    iVar4 = iVar6;
    iVar6 = iVar8;
  }
  *(ulong *)(quad->posA).m_data = CONCAT44(iVar7,iVar6);
  *(ulong *)(quad->posB).m_data = CONCAT44(iVar5,iVar4);
  for (; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
    getRandomColor((InteractionTestUtil *)&local_40,rnd);
    puVar1 = (undefined8 *)((long)quad->color[0].m_data + lVar9);
    *puVar1 = local_40;
    puVar1[1] = uStack_38;
  }
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
    *(float *)((long)quad->depth + lVar9) = fVar10;
  }
  return;
}

Assistant:

void computeRandomQuad (de::Random& rnd, gls::FragmentOpUtil::IntegerQuad& quad, int targetWidth, int targetHeight)
{
	// \note In viewport coordinates.
	// \todo [2012-12-18 pyry] Out-of-bounds values.
	// \note Not using depth 1.0 since clearing with 1.0 and rendering with 1.0 may not be same value.
	static const float depthValues[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.51f, 0.6f, 0.8f, 0.95f };

	const int		maxOutOfBounds		= 0;
	const float		minSize				= 0.5f;

	int minW		= deCeilFloatToInt32(minSize * (float)targetWidth);
	int minH		= deCeilFloatToInt32(minSize * (float)targetHeight);
	int maxW		= targetWidth + 2*maxOutOfBounds;
	int maxH		= targetHeight + 2*maxOutOfBounds;

	int width		= rnd.getInt(minW, maxW);
	int	height		= rnd.getInt(minH, maxH);
	int x			= rnd.getInt(-maxOutOfBounds, targetWidth+maxOutOfBounds-width);
	int y			= rnd.getInt(-maxOutOfBounds, targetHeight+maxOutOfBounds-height);

	bool flipX		= rnd.getBool();
	bool flipY		= rnd.getBool();

	float depth		= rnd.choose<float>(DE_ARRAY_BEGIN(depthValues), DE_ARRAY_END(depthValues));

	quad.posA	= IVec2(flipX ? (x+width-1) : x, flipY ? (y+height-1) : y);
	quad.posB	= IVec2(flipX ? x : (x+width-1), flipY ? y : (y+height-1));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quad.color); ndx++)
		quad.color[ndx] = getRandomColor(rnd);

	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), depth);
}